

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O1

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,FileDescriptor *essence_descriptor,
          InterchangeObject_list_t *essence_sub_descriptor_list,ui32_t *header_size)

{
  ui32_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pcVar4;
  undefined8 *puVar5;
  ILogSink *pIVar6;
  _List_node_base *p_Var7;
  undefined1 *puVar8;
  undefined4 *in_R9;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined **local_138;
  undefined1 local_130;
  undefined8 local_12f;
  undefined8 uStack_127;
  undefined **local_118;
  undefined1 local_110;
  undefined8 local_10f;
  undefined8 uStack_107;
  undefined **local_f8;
  undefined1 local_f0;
  undefined8 local_ef;
  undefined8 uStack_e7;
  long *local_d8;
  undefined7 local_cf;
  long lStack_c8;
  char cStack_c0;
  undefined1 local_70 [9];
  char local_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  char cStack_58;
  undefined1 local_50 [9];
  undefined1 local_47 [16];
  
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    __assert_fail("essence_descriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                  ,0x167,
                  "ASDCP::Result_t AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string &, ASDCP::MXF::FileDescriptor *, ASDCP::MXF::InterchangeObject_list_t &, const ui32_t &)"
                 );
  }
  pcVar4 = (pointer)__dynamic_cast(essence_sub_descriptor_list,&ASDCP::MXF::FileDescriptor::typeinfo
                                   ,&ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
  filename[0x2e]._M_dataplus._M_p = pcVar4;
  if (pcVar4 == (pointer)0x0) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"Essence descriptor is not a WaveAudioDescriptor.\n");
    (*(code *)(essence_sub_descriptor_list->
              super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              )._M_impl._M_node.super__List_node_base._M_next[8]._M_prev)
              (essence_sub_descriptor_list,0);
    puVar8 = RESULT_AS02_FORMAT;
  }
  else {
    if (*(int *)&filename[0x1b].field_2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,*(char **)essence_descriptor,(allocator<char> *)&local_138);
      Kumu::FileWriter::OpenWrite((string *)this);
      if (local_d8 != &lStack_c8) {
        operator_delete(local_d8,lStack_c8 + 1);
      }
      if (*(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                   super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                   super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter < 0) {
        return this;
      }
      *(undefined4 *)&filename[2]._M_string_length = *in_R9;
      *(InterchangeObject_list_t **)((long)&filename[0x18].field_2 + 8) =
           essence_sub_descriptor_list;
      pcVar4 = filename[0x2e]._M_dataplus._M_p;
      *(undefined8 *)(pcVar4 + 0xf0) = *(undefined8 *)(pcVar4 + 0x158);
      puVar1 = *(ui32_t **)header_size;
      do {
        if (puVar1 == header_size) {
          if (*(int *)&filename[0x1b].field_2 == 0) {
            *(undefined4 *)&filename[0x1b].field_2 = 1;
            puVar8 = Kumu::RESULT_OK;
          }
          else {
            puVar8 = Kumu::RESULT_STATE;
          }
          Kumu::Result_t::Result_t((Result_t *)&local_d8,(Result_t *)puVar8);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_d8);
          Kumu::Result_t::~Result_t((Result_t *)&local_d8);
          return this;
        }
        (**(code **)(**(long **)(puVar1 + 4) + 0x10))(&local_d8);
        puVar5 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
        local_130 = 1;
        uVar2 = *puVar5;
        uVar3 = puVar5[1];
        local_138 = &PTR__IArchive_0016cc90;
        local_12f._0_1_ = (char)uVar2;
        local_12f._1_1_ = (char)((ulong)uVar2 >> 8);
        local_12f._2_1_ = (char)((ulong)uVar2 >> 0x10);
        local_12f._3_1_ = (char)((ulong)uVar2 >> 0x18);
        local_12f._4_1_ = (char)((ulong)uVar2 >> 0x20);
        local_12f._5_1_ = (char)((ulong)uVar2 >> 0x28);
        local_12f._6_1_ = (char)((ulong)uVar2 >> 0x30);
        local_12f._7_1_ = (char)((ulong)uVar2 >> 0x38);
        uStack_127._0_1_ = (char)uVar3;
        uStack_127._1_1_ = (char)((ulong)uVar3 >> 8);
        uStack_127._2_1_ = (char)((ulong)uVar3 >> 0x10);
        uStack_127._3_1_ = (char)((ulong)uVar3 >> 0x18);
        uStack_127._4_1_ = (char)((ulong)uVar3 >> 0x20);
        uStack_127._5_1_ = (char)((ulong)uVar3 >> 0x28);
        uStack_127._6_1_ = (char)((ulong)uVar3 >> 0x30);
        uStack_127._7_1_ = (char)((ulong)uVar3 >> 0x38);
        auVar10[0] = -((char)local_12f == (char)local_cf);
        auVar10[1] = -(local_12f._1_1_ == (char)((uint7)local_cf >> 8));
        auVar10[2] = -(local_12f._2_1_ == (char)((uint7)local_cf >> 0x10));
        auVar10[3] = -(local_12f._3_1_ == (char)((uint7)local_cf >> 0x18));
        auVar10[4] = -(local_12f._4_1_ == (char)((uint7)local_cf >> 0x20));
        auVar10[5] = -(local_12f._5_1_ == (char)((uint7)local_cf >> 0x28));
        auVar10[6] = -(local_12f._6_1_ == (char)((uint7)local_cf >> 0x30));
        auVar10[7] = -(local_12f._7_1_ == (char)lStack_c8);
        auVar10[8] = -((char)uStack_127 == (char)((ulong)lStack_c8 >> 8));
        auVar10[9] = -(uStack_127._1_1_ == (char)((ulong)lStack_c8 >> 0x10));
        auVar10[10] = -(uStack_127._2_1_ == (char)((ulong)lStack_c8 >> 0x18));
        auVar10[0xb] = -(uStack_127._3_1_ == (char)((ulong)lStack_c8 >> 0x20));
        auVar10[0xc] = -(uStack_127._4_1_ == (char)((ulong)lStack_c8 >> 0x28));
        auVar10[0xd] = -(uStack_127._5_1_ == (char)((ulong)lStack_c8 >> 0x30));
        auVar10[0xe] = -(uStack_127._6_1_ == (char)((ulong)lStack_c8 >> 0x38));
        auVar10[0xf] = -(uStack_127._7_1_ == cStack_c0);
        local_12f = uVar2;
        uStack_127 = uVar3;
        if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
LAB_00149494:
          bVar9 = false;
        }
        else {
          (**(code **)(**(long **)(puVar1 + 4) + 0x10))(local_50);
          puVar5 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
          local_f0 = 1;
          uVar2 = *puVar5;
          uVar3 = puVar5[1];
          local_f8 = &PTR__IArchive_0016cc90;
          local_ef._0_1_ = (char)uVar2;
          local_ef._1_1_ = (char)((ulong)uVar2 >> 8);
          local_ef._2_1_ = (char)((ulong)uVar2 >> 0x10);
          local_ef._3_1_ = (char)((ulong)uVar2 >> 0x18);
          local_ef._4_1_ = (char)((ulong)uVar2 >> 0x20);
          local_ef._5_1_ = (char)((ulong)uVar2 >> 0x28);
          local_ef._6_1_ = (char)((ulong)uVar2 >> 0x30);
          local_ef._7_1_ = (char)((ulong)uVar2 >> 0x38);
          uStack_e7._0_1_ = (char)uVar3;
          uStack_e7._1_1_ = (char)((ulong)uVar3 >> 8);
          uStack_e7._2_1_ = (char)((ulong)uVar3 >> 0x10);
          uStack_e7._3_1_ = (char)((ulong)uVar3 >> 0x18);
          uStack_e7._4_1_ = (char)((ulong)uVar3 >> 0x20);
          uStack_e7._5_1_ = (char)((ulong)uVar3 >> 0x28);
          uStack_e7._6_1_ = (char)((ulong)uVar3 >> 0x30);
          uStack_e7._7_1_ = (char)((ulong)uVar3 >> 0x38);
          auVar11[0] = -((char)local_ef == local_47[0]);
          auVar11[1] = -(local_ef._1_1_ == local_47[1]);
          auVar11[2] = -(local_ef._2_1_ == local_47[2]);
          auVar11[3] = -(local_ef._3_1_ == local_47[3]);
          auVar11[4] = -(local_ef._4_1_ == local_47[4]);
          auVar11[5] = -(local_ef._5_1_ == local_47[5]);
          auVar11[6] = -(local_ef._6_1_ == local_47[6]);
          auVar11[7] = -(local_ef._7_1_ == local_47[7]);
          auVar11[8] = -((char)uStack_e7 == local_47[8]);
          auVar11[9] = -(uStack_e7._1_1_ == local_47[9]);
          auVar11[10] = -(uStack_e7._2_1_ == local_47[10]);
          auVar11[0xb] = -(uStack_e7._3_1_ == local_47[0xb]);
          auVar11[0xc] = -(uStack_e7._4_1_ == local_47[0xc]);
          auVar11[0xd] = -(uStack_e7._5_1_ == local_47[0xd]);
          auVar11[0xe] = -(uStack_e7._6_1_ == local_47[0xe]);
          auVar11[0xf] = -(uStack_e7._7_1_ == local_47[0xf]);
          local_ef = uVar2;
          uStack_e7 = uVar3;
          if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar11[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00149494;
          (**(code **)(**(long **)(puVar1 + 4) + 0x10))(local_70);
          puVar5 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
          local_110 = 1;
          uVar2 = *puVar5;
          uVar3 = puVar5[1];
          local_118 = &PTR__IArchive_0016cc90;
          local_10f._0_1_ = (char)uVar2;
          local_10f._1_1_ = (char)((ulong)uVar2 >> 8);
          local_10f._2_1_ = (char)((ulong)uVar2 >> 0x10);
          local_10f._3_1_ = (char)((ulong)uVar2 >> 0x18);
          local_10f._4_1_ = (char)((ulong)uVar2 >> 0x20);
          local_10f._5_1_ = (char)((ulong)uVar2 >> 0x28);
          local_10f._6_1_ = (char)((ulong)uVar2 >> 0x30);
          local_10f._7_1_ = (char)((ulong)uVar2 >> 0x38);
          uStack_107._0_1_ = (char)uVar3;
          uStack_107._1_1_ = (char)((ulong)uVar3 >> 8);
          uStack_107._2_1_ = (char)((ulong)uVar3 >> 0x10);
          uStack_107._3_1_ = (char)((ulong)uVar3 >> 0x18);
          uStack_107._4_1_ = (char)((ulong)uVar3 >> 0x20);
          uStack_107._5_1_ = (char)((ulong)uVar3 >> 0x28);
          uStack_107._6_1_ = (char)((ulong)uVar3 >> 0x30);
          uStack_107._7_1_ = (char)((ulong)uVar3 >> 0x38);
          auVar12[0] = -((char)local_10f == local_67);
          auVar12[1] = -(local_10f._1_1_ == cStack_66);
          auVar12[2] = -(local_10f._2_1_ == cStack_65);
          auVar12[3] = -(local_10f._3_1_ == cStack_64);
          auVar12[4] = -(local_10f._4_1_ == cStack_63);
          auVar12[5] = -(local_10f._5_1_ == cStack_62);
          auVar12[6] = -(local_10f._6_1_ == cStack_61);
          auVar12[7] = -(local_10f._7_1_ == cStack_60);
          auVar12[8] = -((char)uStack_107 == cStack_5f);
          auVar12[9] = -(uStack_107._1_1_ == cStack_5e);
          auVar12[10] = -(uStack_107._2_1_ == cStack_5d);
          auVar12[0xb] = -(uStack_107._3_1_ == cStack_5c);
          auVar12[0xc] = -(uStack_107._4_1_ == cStack_5b);
          auVar12[0xd] = -(uStack_107._5_1_ == cStack_5a);
          auVar12[0xe] = -(uStack_107._6_1_ == cStack_59);
          auVar12[0xf] = -(uStack_107._7_1_ == cStack_58);
          bVar9 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff;
          local_10f = uVar2;
          uStack_107 = uVar3;
        }
        if (bVar9) {
          pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error(pIVar6,"Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
          (**(code **)(**(long **)(puVar1 + 4) + 0x88))(*(long **)(puVar1 + 4),0);
        }
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = *(_List_node_base **)(puVar1 + 4);
        std::__detail::_List_node_base::_M_hook(p_Var7);
        filename[0x19].field_2._M_allocated_capacity =
             filename[0x19].field_2._M_allocated_capacity + 1;
        Kumu::GenRandomValue((UUID *)(*(long *)(puVar1 + 4) + 0x58));
        std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
                  ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                   (*(long *)((long)&filename[0x18].field_2 + 8) + 200),
                   (value_type *)(*(long *)(puVar1 + 4) + 0x58));
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1 = *(ui32_t **)puVar1;
      } while( true );
    }
    puVar8 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar8);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ASDCP::MXF::FileDescriptor* essence_descriptor,
					    ASDCP::MXF::InterchangeObject_list_t& essence_sub_descriptor_list, const ui32_t& header_size)
{
  assert(essence_descriptor);

  m_WaveAudioDescriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(essence_descriptor);

  if ( m_WaveAudioDescriptor == 0 )
    {
      DefaultLogSink().Error("Essence descriptor is not a WaveAudioDescriptor.\n");
      essence_descriptor->Dump();
      return RESULT_AS02_FORMAT;
    }

  if ( ! m_State.Test_BEGIN() )
    {
      return RESULT_STATE;
    }

  Result_t result = m_File.OpenWrite(filename.c_str());

  if ( KM_SUCCESS(result) )
    {
      m_HeaderSize = header_size;
      m_EssenceDescriptor = essence_descriptor;
      m_WaveAudioDescriptor->SampleRate = m_WaveAudioDescriptor->AudioSamplingRate;

      ASDCP::MXF::InterchangeObject_list_t::iterator i;
      for ( i = essence_sub_descriptor_list.begin(); i != essence_sub_descriptor_list.end(); ++i )
	{
	  if ( (*i)->GetUL() != UL(m_Dict->ul(MDD_AudioChannelLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_SoundfieldGroupLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_GroupOfSoundfieldGroupsLabelSubDescriptor)) )
	    {
	      DefaultLogSink().Error("Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
	      (*i)->Dump();
	    }

	  m_EssenceSubDescriptorList.push_back(*i);
	  GenRandomValue((*i)->InstanceUID);
	  m_EssenceDescriptor->SubDescriptors.push_back((*i)->InstanceUID);
	  *i = 0; // parent will only free the ones we don't keep
	}

      result = m_State.Goto_INIT();
    }

  return result;
}